

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

_Bool ftp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *code)

{
  int iVar1;
  undefined4 local_40 [2];
  curl_off_t status;
  int *code_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((((3 < len) && ('/' < *line)) && (*line < ':')) && (('/' < line[1] && (line[1] < ':')))) &&
      (('/' < line[2] && ((line[2] < ':' && (line[3] == ' ')))))) &&
     (status = (curl_off_t)code, code_local = (int *)len, len_local = (size_t)line,
     line_local = (char *)conn, conn_local = (connectdata *)data,
     iVar1 = Curl_str_number((char **)&len_local,(curl_off_t *)local_40,999), iVar1 == 0)) {
    *(undefined4 *)status = local_40[0];
    return true;
  }
  return false;
}

Assistant:

static bool ftp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                          const char *line, size_t len, int *code)
{
  curl_off_t status;
  (void)data;
  (void)conn;

  if((len > 3) && LASTLINE(line) && !Curl_str_number(&line, &status, 999)) {
    *code = (int)status;
    return TRUE;
  }

  return FALSE;
}